

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::ComputeCacheTestInstance::prepareCommandBuffer
          (ComputeCacheTestInstance *this)

{
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  VkResult VVar3;
  VkCommandBufferInheritanceInfo *pVVar4;
  VkCommandBuffer_s **ppVVar5;
  Handle<(vk::HandleType)18> *pHVar6;
  Handle<(vk::HandleType)16> *pHVar7;
  Handle<(vk::HandleType)22> *pHVar8;
  uint local_3c;
  undefined8 uStack_38;
  deUint32 ndx;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  DeviceInterface *vk;
  ComputeCacheTestInstance *this_local;
  
  pVVar4 = (VkCommandBufferInheritanceInfo *)
           Context::getDeviceInterface((this->super_CacheTestInstance).super_TestInstance.m_context)
  ;
  uStack_38 = 0x2a;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  cmdBufferBeginInfo.pNext = (void *)0x0;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  cmdBufferBeginInfo.pInheritanceInfo = pVVar4;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_CacheTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar3 = (*(*(_func_int ***)pVVar4)[0x49])(pVVar4,*ppVVar5,&stack0xffffffffffffffc8);
  ::vk::checkResult(VVar3,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x57b);
  for (local_3c = 0; pVVar4 = cmdBufferBeginInfo.pInheritanceInfo, local_3c < 2;
      local_3c = local_3c + 1) {
    ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_CacheTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar1 = *ppVVar5;
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                       (&this->m_pipeline[local_3c].super_RefBase<vk::Handle<(vk::HandleType)18>_>);
    (**(code **)(*(long *)pVVar4 + 0x260))(pVVar4,pVVar1,1,pHVar6->m_internal);
    pVVar4 = cmdBufferBeginInfo.pInheritanceInfo;
    ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_CacheTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar1 = *ppVVar5;
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                       (&this->m_pipelineLayout[local_3c].
                         super_RefBase<vk::Handle<(vk::HandleType)16>_>);
    dVar2 = pHVar7->m_internal;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                       (&this->m_descriptorSet[local_3c].
                         super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    (**(code **)(*(long *)pVVar4 + 0x2b0))(pVVar4,pVVar1,1,dVar2,0,1,pHVar8,0,0);
    pVVar4 = cmdBufferBeginInfo.pInheritanceInfo;
    ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_CacheTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    (**(code **)(*(long *)pVVar4 + 0x2e8))(pVVar4,*ppVVar5,0x80,1);
  }
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_CacheTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar3 = (**(code **)(*(long *)pVVar4 + 0x250))(pVVar4,*ppVVar5);
  ::vk::checkResult(VVar3,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x584);
  return;
}

Assistant:

void ComputeCacheTestInstance::prepareCommandBuffer (void)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,    // VkStructureType                  sType;
		DE_NULL,                                        // const void*                      pNext;
		0u,                                             // VkCommandBufferUsageFlags        flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));

	for (deUint32 ndx = 0; ndx < PIPELINE_CACHE_NDX_COUNT; ndx++)
	{
		vk.cmdBindPipeline(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *m_pipeline[ndx]);
		vk.cmdBindDescriptorSets(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *m_pipelineLayout[ndx], 0u, 1u, &m_descriptorSet[ndx].get(), 0u, DE_NULL);
		vk.cmdDispatch(*m_cmdBuffer, 128u, 1u, 1u);
	}

	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));
}